

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

void * google::protobuf::Arena::CopyConstruct<proto2_unittest::TestAllTypesLite_NestedMessage>
                 (Arena *arena,void *from)

{
  TestAllTypesLite_NestedMessage *this;
  
  if (arena == (Arena *)0x0) {
    this = (TestAllTypesLite_NestedMessage *)operator_new(0x40);
  }
  else {
    this = (TestAllTypesLite_NestedMessage *)Allocate(arena,0x40);
  }
  proto2_unittest::TestAllTypesLite_NestedMessage::TestAllTypesLite_NestedMessage
            (this,arena,(TestAllTypesLite_NestedMessage *)from);
  return this;
}

Assistant:

PROTOBUF_NOINLINE void* PROTOBUF_NONNULL Arena::CopyConstruct(
    Arena* PROTOBUF_NULLABLE arena, const void* PROTOBUF_NONNULL from) {
  // If the object is larger than half a cache line, prefetch it.
  // This way of prefetching is a little more aggressive than if we
  // condition off a whole cache line, but benchmarks show better results.
  if (sizeof(T) > ABSL_CACHELINE_SIZE / 2) {
    PROTOBUF_PREFETCH_WITH_OFFSET(from, 64);
  }
  static_assert(is_destructor_skippable<T>::value, "");
  void* mem = arena != nullptr ? arena->AllocateAligned(sizeof(T))
                               : ::operator new(sizeof(T));
  return new (mem) T(arena, *static_cast<const T*>(from));
}